

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

ps_nbest_t * ps_nbest(ps_decoder_t *ps)

{
  ps_search_t *ppVar1;
  int iVar2;
  ps_lattice_t *dag;
  ps_astar_t *nbest;
  ps_latpath_t *ppVar3;
  ngram_model_t *lmset;
  float32 lwf;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x5c2,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
  }
  else {
    dag = ps_get_lattice(ps);
    if (dag != (ps_lattice_t *)0x0) {
      ppVar1 = ps->search;
      iVar2 = strcmp(ppVar1->type,"ngram");
      if (iVar2 == 0) {
        lmset = (ngram_model_t *)ppVar1[1].vt;
        lwf = (float32)ppVar1[3].n_words;
      }
      else {
        lwf = 1.0;
        lmset = (ngram_model_t *)0x0;
      }
      nbest = ps_astar_start(dag,lmset,lwf,0,-1,-1,-1);
      ppVar3 = ps_astar_next(nbest);
      if (ppVar3 != (ps_latpath_t *)0x0) {
        return nbest;
      }
      ps_astar_finish(nbest);
    }
  }
  return (ps_nbest_t *)0x0;
}

Assistant:

ps_nbest_t *
ps_nbest(ps_decoder_t *ps)
{
    ps_lattice_t *dag;
    ngram_model_t *lmset;
    ps_astar_t *nbest;
    float32 lwf;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return NULL;
    }
    if ((dag = ps_get_lattice(ps)) == NULL)
        return NULL;

    /* FIXME: This is all quite specific to N-Gram search.  Either we
     * should make N-best a method for each search module or it needs
     * to be abstracted to work for N-Gram and FSG. */
    if (0 != strcmp(ps_search_type(ps->search), PS_SEARCH_TYPE_NGRAM)) {
        lmset = NULL;
        lwf = 1.0f;
    } else {
        lmset = ((ngram_search_t *)ps->search)->lmset;
        lwf = ((ngram_search_t *)ps->search)->bestpath_fwdtree_lw_ratio;
    }

    nbest = ps_astar_start(dag, lmset, lwf, 0, -1, -1, -1);

    nbest = ps_nbest_next(nbest);

    return (ps_nbest_t *)nbest;
}